

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objloader.cpp
# Opt level: O0

MeshData ObjLoader::loadOBJ(string *filePath,bool *succes)

{
  pointer *this;
  pointer *this_00;
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  MeshData MVar4;
  PFNGLBUFFERDATAPROC p_Var5;
  int iVar6;
  ResourceManager *pRVar7;
  undefined8 uVar8;
  char *__filename;
  FILE *__stream;
  size_type sVar9;
  reference pvVar10;
  anon_struct_8_2_947311e6_for_anon_union_8_3_e2189aaa_for_tvec2<float,_(glm::precision)0>_2_0
  *paVar11;
  reference pvVar12;
  reference pvVar13;
  MeshData MVar14;
  string local_6e8 [32];
  string *local_6c8;
  MeshData MStack_6c0;
  undefined1 local_6b0 [8];
  vec3 normal_1;
  vec2 uv_1;
  vec3 vertex_1;
  uint normalIndex_1;
  uint uvIndex_1;
  uint vertexIndex_1;
  uint i;
  char stupidBuffer [1000];
  value_type_conflict1 local_284;
  int matches;
  uint normalIndex [3];
  uint uvIndex [3];
  uint vertexIndex [3];
  string vertex3;
  string local_240 [8];
  string vertex2;
  string local_220 [8];
  string vertex1;
  undefined1 local_1fc [8];
  vec3 normal;
  vec2 uv;
  vec3 vertex;
  int res;
  char lineHeader [128];
  FILE *file;
  vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
  out_normals;
  vector<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
  out_uvs;
  vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
  out_vertices;
  vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
  temp_normals;
  vector<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
  temp_uvs;
  vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
  temp_vertices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> normalIndices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> uvIndices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vertexIndices;
  string local_58 [32];
  undefined8 uStack_38;
  MeshData meshData;
  bool *succes_local;
  string *filePath_local;
  GLuint local_10;
  GLuint GStack_c;
  
  *succes = false;
  meshData._8_8_ = succes;
  pRVar7 = ResourceManager::getInstance();
  std::__cxx11::string::string(local_58,(string *)filePath);
  MVar14 = ResourceManager::getMeshData(pRVar7,(string *)local_58,(bool *)meshData._8_8_);
  meshData._0_8_ = MVar14._8_8_;
  uStack_38 = MVar14._0_8_;
  std::__cxx11::string::~string(local_58);
  if ((*(byte *)meshData._8_8_ & 1) == 0) {
    uVar8 = std::__cxx11::string::c_str();
    printf("Loading OBJ file %s...\n",uVar8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &uvIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &normalIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &temp_vertices.
                super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
    ::vector((vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
              *)&temp_uvs.
                 super__Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
    ::vector((vector<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
              *)&temp_normals.
                 super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
    ::vector((vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
              *)&out_vertices.
                 super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
    ::vector((vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
              *)&out_uvs.
                 super__Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
    ::vector((vector<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
              *)&out_normals.
                 super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
    ::vector((vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
              *)&file);
    __filename = (char *)std::__cxx11::string::c_str();
    __stream = fopen(__filename,"r");
    if (__stream != (FILE *)0x0) {
LAB_001b4f12:
      while (vertex.field_0.field_0.y =
                  (float)__isoc99_fscanf(__stream,"%s",(undefined1 *)((long)&vertex.field_0 + 8)),
            vertex.field_0.field_0.y != -NAN) {
        iVar6 = strcmp((char *)((long)&vertex.field_0 + 8),"v");
        if (iVar6 == 0) {
          glm::tvec3<float,_(glm::precision)0>::tvec3((tvec3<float,_(glm::precision)0> *)&uv);
          __isoc99_fscanf(__stream,"%f %f %f\n",&uv,(undefined1 *)((long)&uv.field_0 + 4),&vertex);
          std::
          vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
          ::push_back((vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                       *)&temp_uvs.
                          super__Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&uv);
        }
        else {
          iVar6 = strcmp((char *)((long)&vertex.field_0 + 8),"vt");
          if (iVar6 == 0) {
            glm::tvec2<float,_(glm::precision)0>::tvec2
                      ((tvec2<float,_(glm::precision)0> *)((long)&normal.field_0 + 4));
            __isoc99_fscanf(__stream,"%f %f\n",(undefined1 *)((long)&normal.field_0 + 4),
                            (undefined1 *)((long)&normal.field_0 + 8));
            normal.field_0.field_0.z = -normal.field_0.field_0.z;
            std::
            vector<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
            ::push_back((vector<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
                         *)&temp_normals.
                            super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (value_type *)((long)&normal.field_0 + 4));
          }
          else {
            iVar6 = strcmp((char *)((long)&vertex.field_0 + 8),"vn");
            if (iVar6 == 0) {
              glm::tvec3<float,_(glm::precision)0>::tvec3
                        ((tvec3<float,_(glm::precision)0> *)local_1fc);
              __isoc99_fscanf(__stream,"%f %f %f\n",local_1fc,local_1fc + 4,&normal);
              std::
              vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
              ::push_back((vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                           *)&out_vertices.
                              super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (value_type *)local_1fc);
            }
            else {
              iVar6 = strcmp((char *)((long)&vertex.field_0 + 8),"f");
              if (iVar6 == 0) goto code_r0x001b50c6;
              fgets((char *)&vertexIndex_1,1000,__stream);
            }
          }
        }
      }
      for (uvIndex_1 = 0;
          sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             &uvIndices.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage), uvIndex_1 < sVar9;
          uvIndex_1 = uvIndex_1 + 1) {
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             &uvIndices.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uvIndex_1);
        vVar1 = *pvVar10;
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             &normalIndices.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uvIndex_1);
        vVar2 = *pvVar10;
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             &temp_vertices.
                              super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uvIndex_1);
        vVar3 = *pvVar10;
        paVar11 = (anon_struct_8_2_947311e6_for_anon_union_8_3_e2189aaa_for_tvec2<float,_(glm::precision)0>_2_0
                   *)std::
                     vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                     ::operator[]((vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                                   *)&temp_uvs.
                                      super__Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (ulong)(vVar1 - 1));
        uv_1.field_0.field_0 =
             *(anon_union_8_3_e2189aaa_for_tvec2<float,_(glm::precision)0>_2 *)paVar11;
        paVar11 = (anon_struct_8_2_947311e6_for_anon_union_8_3_e2189aaa_for_tvec2<float,_(glm::precision)0>_2_0
                   *)std::
                     vector<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
                     ::operator[]((vector<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
                                   *)&temp_normals.
                                      super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (ulong)(vVar2 - 1));
        unique0x00012000 = *paVar11;
        pvVar12 = std::
                  vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                  ::operator[]((vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                                *)&out_vertices.
                                   super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (ulong)(vVar3 - 1));
        normal_1.field_0.field_0.x = (pvVar12->field_0).field_0.z;
        local_6b0 = *(undefined1 (*) [8])&pvVar12->field_0;
        std::
        vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
        ::push_back((vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                     *)&out_uvs.
                        super__Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&uv_1);
        std::
        vector<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
        ::push_back((vector<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
                     *)&out_normals.
                        super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (value_type *)((long)&normal_1.field_0 + 8));
        std::
        vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
        ::push_back((vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                     *)&file,(value_type *)local_6b0);
      }
      *(undefined1 *)meshData._8_8_ = 1;
      (*__glewBindVertexArray)((GLuint)uStack_38);
      (*__glewGenBuffers)(1,(GLuint *)&uStack_38);
      (*__glewBindBuffer)(0x8892,(GLuint)uStack_38);
      p_Var5 = __glewBufferData;
      this = &out_uvs.
              super__Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
      sVar9 = std::
              vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
              ::size((vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                      *)this);
      pvVar12 = std::
                vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                ::operator[]((vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                              *)this,0);
      (*p_Var5)(0x8892,sVar9 * 0xc,pvVar12,0x88e4);
      (*__glewGenBuffers)(1,&meshData.vertexBuffer);
      (*__glewBindBuffer)(0x8892,meshData.vertexBuffer);
      p_Var5 = __glewBufferData;
      this_00 = &out_normals.
                 super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      sVar9 = std::
              vector<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
              ::size((vector<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
                      *)this_00);
      pvVar13 = std::
                vector<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
                ::operator[]((vector<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
                              *)this_00,0);
      (*p_Var5)(0x8892,sVar9 << 3,pvVar13,0x88e4);
      (*__glewGenBuffers)(1,(GLuint *)((long)&uStack_38 + 4));
      (*__glewBindBuffer)(0x8892,uStack_38._4_4_);
      p_Var5 = __glewBufferData;
      sVar9 = std::
              vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
              ::size((vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                      *)&file);
      pvVar12 = std::
                vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                ::operator[]((vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                              *)&file,0);
      (*p_Var5)(0x8892,sVar9 * 0xc,pvVar12,0x88e4);
      sVar9 = std::
              vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
              ::size((vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                      *)&out_uvs.
                         super__Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      meshData.normalBuffer = (GLuint)sVar9;
      pRVar7 = ResourceManager::getInstance();
      local_6c8 = uStack_38;
      MStack_6c0.vertexBuffer = meshData.vertexBuffer;
      MStack_6c0.normalBuffer = meshData.normalBuffer;
      std::__cxx11::string::string(local_6e8,(string *)filePath);
      MVar14.uvBuffer = MStack_6c0.vertexBuffer;
      MVar14.numVerts = MStack_6c0.normalBuffer;
      MVar14._0_8_ = local_6c8;
      ResourceManager::addMeshData(pRVar7,MVar14,(string *)local_6e8);
      std::__cxx11::string::~string(local_6e8);
      filePath_local = uStack_38;
      local_10 = meshData.vertexBuffer;
      GStack_c = meshData.normalBuffer;
      goto LAB_001b5699;
    }
    printf("Impossible to open the file ! Are you in the right path ?");
    getchar();
    MeshData::MeshData((MeshData *)&filePath_local);
LAB_001b5699:
    std::
    vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
    ::~vector((vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
               *)&file);
    std::
    vector<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
    ::~vector((vector<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
               *)&out_normals.
                  super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
    ::~vector((vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
               *)&out_uvs.
                  super__Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
    ::~vector((vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
               *)&out_vertices.
                  super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
    ::~vector((vector<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
               *)&temp_normals.
                  super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
    ::~vector((vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
               *)&temp_uvs.
                  super__Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &temp_vertices.
                super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &normalIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &uvIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  else {
    filePath_local = uStack_38;
    local_10 = meshData.vertexBuffer;
    GStack_c = meshData.normalBuffer;
  }
  MVar4.uvBuffer = local_10;
  MVar4.numVerts = GStack_c;
  MVar4._0_8_ = filePath_local;
  return MVar4;
code_r0x001b50c6:
  std::__cxx11::string::string(local_220);
  std::__cxx11::string::string(local_240);
  std::__cxx11::string::string((string *)(vertexIndex + 1));
  iVar6 = __isoc99_fscanf(__stream,"%d/%d/%d %d/%d/%d %d/%d/%d\n",uvIndex + 1,normalIndex + 1,
                          &local_284,uvIndex + 2,normalIndex + 2,&matches,vertexIndex,uvIndex,
                          normalIndex);
  if (iVar6 == 9) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &uvIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,uvIndex + 1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &uvIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,uvIndex + 2);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &uvIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,vertexIndex);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &normalIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,normalIndex + 1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &normalIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,normalIndex + 2);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &normalIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,uvIndex);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &temp_vertices.
                super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_284);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &temp_vertices.
                super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type_conflict1 *)&matches)
    ;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &temp_vertices.
                super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,normalIndex);
  }
  else {
    printf("File can\'t be read by this simple parser :-( Try exporting with other options\n");
    MeshData::MeshData((MeshData *)&filePath_local);
  }
  std::__cxx11::string::~string((string *)(vertexIndex + 1));
  std::__cxx11::string::~string(local_240);
  std::__cxx11::string::~string(local_220);
  if (iVar6 != 9) goto LAB_001b5699;
  goto LAB_001b4f12;
}

Assistant:

MeshData ObjLoader::loadOBJ(std::string filePath, bool &succes)
{
	succes = false;
	MeshData meshData = ResourceManager::getInstance()->getMeshData(filePath, succes);
	if (succes)
	{
		return meshData;
	}
	printf("Loading OBJ file %s...\n", filePath.c_str());

	std::vector<unsigned int> vertexIndices, uvIndices, normalIndices;
	std::vector<glm::vec3> temp_vertices;
	std::vector<glm::vec2> temp_uvs;
	std::vector<glm::vec3> temp_normals;

	std::vector<glm::vec3> out_vertices;
	std::vector<glm::vec2> out_uvs;
	std::vector<glm::vec3> out_normals;


	FILE * file = fopen(filePath.c_str(), "r");
	if (file == NULL)
	{
		printf("Impossible to open the file ! Are you in the right path ?");
		getchar();
		return MeshData();
	}

	while (1)
	{

		char lineHeader[128];
		// read the first word of the line
		int res = fscanf(file, "%s", lineHeader);
		if (res == EOF)
			break; // EOF = End Of File. Quit the loop.

		// else : parse lineHeader

		if (strcmp(lineHeader, "v") == 0)
		{
			glm::vec3 vertex;
			fscanf(file, "%f %f %f\n", &vertex.x, &vertex.y, &vertex.z);
			temp_vertices.push_back(vertex);
		}
		else if (strcmp(lineHeader, "vt") == 0)
		{
			glm::vec2 uv;
			fscanf(file, "%f %f\n", &uv.x, &uv.y);
			uv.y = -uv.y; // Invert V coordinate since we will only use DDS texture, which are inverted. Remove if you want to use TGA or BMP loaders.
			temp_uvs.push_back(uv);
		}
		else if (strcmp(lineHeader, "vn") == 0)
		{
			glm::vec3 normal;
			fscanf(file, "%f %f %f\n", &normal.x, &normal.y, &normal.z);
			temp_normals.push_back(normal);
		}
		else if (strcmp(lineHeader, "f") == 0)
		{
			std::string vertex1, vertex2, vertex3;
			unsigned int vertexIndex[3], uvIndex[3], normalIndex[3];
			int matches = fscanf(file, "%d/%d/%d %d/%d/%d %d/%d/%d\n", &vertexIndex[0], &uvIndex[0], &normalIndex[0], &vertexIndex[1], &uvIndex[1], &normalIndex[1], &vertexIndex[2], &uvIndex[2], &normalIndex[2]);
			if (matches != 9)
			{
				printf("File can't be read by this simple parser :-( Try exporting with other options\n");
				return MeshData();
			}
			vertexIndices.push_back(vertexIndex[0]);
			vertexIndices.push_back(vertexIndex[1]);
			vertexIndices.push_back(vertexIndex[2]);
			uvIndices.push_back(uvIndex[0]);
			uvIndices.push_back(uvIndex[1]);
			uvIndices.push_back(uvIndex[2]);
			normalIndices.push_back(normalIndex[0]);
			normalIndices.push_back(normalIndex[1]);
			normalIndices.push_back(normalIndex[2]);
		}
		else
		{
			// Probably a comment, eat up the rest of the line
			char stupidBuffer[1000];
			fgets(stupidBuffer, 1000, file);
		}

	}

	// For each vertex of each triangle
	for (unsigned int i = 0; i < vertexIndices.size(); i++)
	{

		// Get the indices of its attributes
		unsigned int vertexIndex = vertexIndices[i];
		unsigned int uvIndex = uvIndices[i];
		unsigned int normalIndex = normalIndices[i];

		// Get the attributes thanks to the index
		glm::vec3 vertex = temp_vertices[vertexIndex - 1];
		glm::vec2 uv = temp_uvs[uvIndex - 1];
		glm::vec3 normal = temp_normals[normalIndex - 1];

		// Put the attributes in buffers
		out_vertices.push_back(vertex);
		out_uvs.push_back(uv);
		out_normals.push_back(normal);
		
	}
	succes = true;

	glBindVertexArray(meshData.vertexBuffer);
	glGenBuffers(1, &meshData.vertexBuffer);
	glBindBuffer(GL_ARRAY_BUFFER, meshData.vertexBuffer);
	glBufferData(GL_ARRAY_BUFFER, out_vertices.size() * sizeof(glm::vec3), &out_vertices[0], GL_STATIC_DRAW);

	glGenBuffers(1, &meshData.uvBuffer);
	glBindBuffer(GL_ARRAY_BUFFER, meshData.uvBuffer);
	glBufferData(GL_ARRAY_BUFFER, out_uvs.size() * sizeof(glm::vec2), &out_uvs[0], GL_STATIC_DRAW);

	glGenBuffers(1, &meshData.normalBuffer);
	glBindBuffer(GL_ARRAY_BUFFER, meshData.normalBuffer);
	glBufferData(GL_ARRAY_BUFFER, out_normals.size() * sizeof(glm::vec3), &out_normals[0], GL_STATIC_DRAW);
	
	meshData.numVerts = out_vertices.size();
	ResourceManager::getInstance()->addMeshData(meshData, filePath);
	return meshData;
}